

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O2

int anon_unknown.dwarf_22d10::ChannelOut_programchange(lua_State *L)

{
  ChannelOut *this;
  ulong xs_1;
  
  this = getChannelOut(L,1);
  xs_1 = luaL_checkinteger(L,2);
  if (0x7f < xs_1) {
    luaL_argerror(L,2,"MIDI program number must be between 0 and 127");
  }
  ChannelOut::send<int,long_long>(this,this->index + 0xc0,xs_1);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_programchange(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer value = luaL_checkinteger(L, 2);

	luaL_argcheck(L, value >= 0 && value <= 0x7F, 2, "MIDI program number must be between 0 and 127");

	self.send(0xC0 + self.index, value);
	lua_settop(L, 1);
	return 1;
}